

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DirectorySnapshotDiff.cpp
# Opt level: O3

bool __thiscall efsw::DirectorySnapshotDiff::changed(DirectorySnapshotDiff *this)

{
  _List_node_base *p_Var1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  _List_node_base *p_Var4;
  int iVar6;
  undefined1 auVar5 [16];
  undefined1 auVar7 [16];
  long lVar11;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  undefined1 auVar16 [16];
  
  iVar6 = (int)((ulong)this >> 0x20);
  auVar7._8_4_ = (int)this;
  auVar7._0_8_ = this;
  auVar7._12_4_ = iVar6;
  lVar11 = auVar7._8_8_;
  p_Var1 = (this->FilesModified).super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  p_Var2 = (this->FilesCreated).super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  auVar10._0_4_ = -(uint)((int)p_Var2 == (int)&this->FilesCreated);
  auVar10._4_4_ = -(uint)((int)((ulong)p_Var2 >> 0x20) == (int)((ulong)&this->FilesCreated >> 0x20))
  ;
  auVar10._8_4_ = -(uint)((int)p_Var1 == (int)(lVar11 + 0x30));
  auVar10._12_4_ = -(uint)((int)((ulong)p_Var1 >> 0x20) == (int)((ulong)(lVar11 + 0x30) >> 0x20));
  p_Var1 = (this->FilesDeleted).super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  p_Var2 = (this->FilesMoved).
           super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  p_Var3 = (this->DirsModified).super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  p_Var4 = (this->DirsCreated).super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  auVar16._0_4_ = -(uint)((int)p_Var4 == (int)&this->DirsCreated);
  auVar16._4_4_ = -(uint)((int)((ulong)p_Var4 >> 0x20) == (int)((ulong)&this->DirsCreated >> 0x20));
  auVar16._8_4_ = -(uint)((int)p_Var3 == (int)(lVar11 + 0x90));
  auVar16._12_4_ = -(uint)((int)((ulong)p_Var3 >> 0x20) == (int)((ulong)(lVar11 + 0x90) >> 0x20));
  p_Var3 = (this->DirsDeleted).super__List_base<efsw::FileInfo,_std::allocator<efsw::FileInfo>_>.
           _M_impl._M_node.super__List_node_base._M_next;
  p_Var4 = (this->DirsMoved).
           super__List_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_efsw::FileInfo>_>_>
           ._M_impl._M_node.super__List_node_base._M_next;
  auVar14._0_4_ = -(uint)((int)p_Var4 == (int)&this->DirsMoved);
  auVar14._4_4_ = -(uint)((int)((ulong)p_Var4 >> 0x20) == (int)((ulong)&this->DirsMoved >> 0x20));
  auVar14._8_4_ = -(uint)((int)p_Var3 == (int)(lVar11 + 0x60));
  auVar14._12_4_ = -(uint)((int)((ulong)p_Var3 >> 0x20) == (int)((ulong)(lVar11 + 0x60) >> 0x20));
  auVar8._0_4_ = -(uint)((int)&this->FilesMoved == (int)p_Var2);
  auVar8._4_4_ = -(uint)((int)((ulong)&this->FilesMoved >> 0x20) == (int)((ulong)p_Var2 >> 0x20));
  auVar8._8_4_ = -(uint)((int)this == (int)p_Var1);
  auVar8._12_4_ = -(uint)(iVar6 == (int)((ulong)p_Var1 >> 0x20));
  auVar13._4_4_ = auVar14._0_4_;
  auVar13._0_4_ = auVar14._4_4_;
  auVar13._8_4_ = auVar14._12_4_;
  auVar13._12_4_ = auVar14._8_4_;
  auVar12._4_4_ = auVar16._0_4_;
  auVar12._0_4_ = auVar16._4_4_;
  auVar12._8_4_ = auVar16._12_4_;
  auVar12._12_4_ = auVar16._8_4_;
  auVar13 = packssdw(auVar12 & auVar16,auVar13 & auVar14);
  auVar5._8_4_ = 0xffffffff;
  auVar5._0_8_ = 0xffffffffffffffff;
  auVar5._12_4_ = 0xffffffff;
  auVar15._4_4_ = auVar8._0_4_;
  auVar15._0_4_ = auVar8._4_4_;
  auVar15._8_4_ = auVar8._12_4_;
  auVar15._12_4_ = auVar8._8_4_;
  auVar9._4_4_ = auVar10._0_4_;
  auVar9._0_4_ = auVar10._4_4_;
  auVar9._8_4_ = auVar10._12_4_;
  auVar9._12_4_ = auVar10._8_4_;
  auVar10 = packssdw(auVar9 & auVar10,auVar15 & auVar8);
  auVar10 = packssdw(auVar10 ^ auVar5,auVar13 ^ auVar5);
  return (((((((auVar10 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
              (auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar10 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar10 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar10 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) || auVar10[0xf] < '\0';
}

Assistant:

bool DirectorySnapshotDiff::changed()
{
	return	!FilesCreated.empty()	||
			!FilesModified.empty()	||
			!FilesMoved.empty()		||
			!FilesDeleted.empty()	||
			!DirsCreated.empty()	||
			!DirsModified.empty()	||
			!DirsMoved.empty()		||
			!DirsDeleted.empty();
}